

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

string * google::protobuf::compiler::js::(anonymous_namespace)::JSTypeTag_abi_cxx11_
                   (FieldDescriptor *desc)

{
  bool bVar1;
  Type TVar2;
  string *in_RDI;
  FieldDescriptor *in_stack_ffffffffffffff78;
  allocator *paVar3;
  FieldDescriptor *in_stack_ffffffffffffff90;
  allocator local_2b;
  allocator local_2a;
  allocator local_29;
  allocator local_28;
  allocator local_27;
  allocator local_26;
  allocator local_25 [20];
  allocator local_11 [17];
  
  TVar2 = FieldDescriptor::type(in_stack_ffffffffffffff90);
  switch(TVar2) {
  case TYPE_DOUBLE:
  case TYPE_FLOAT:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Float",local_11);
    std::allocator<char>::~allocator((allocator<char> *)local_11);
    break;
  case TYPE_INT64:
  case TYPE_UINT64:
  case TYPE_INT32:
  case TYPE_FIXED64:
  case TYPE_FIXED32:
  case TYPE_UINT32:
  case TYPE_SFIXED32:
  case TYPE_SFIXED64:
  case TYPE_SINT32:
  case MAX_TYPE:
    bVar1 = anon_unknown_0::IsIntegralFieldWithStringJSType(in_stack_ffffffffffffff78);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"StringInt",local_25);
      std::allocator<char>::~allocator((allocator<char> *)local_25);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"Int",&local_26);
      std::allocator<char>::~allocator((allocator<char> *)&local_26);
    }
    break;
  case TYPE_BOOL:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Boolean",&local_27);
    std::allocator<char>::~allocator((allocator<char> *)&local_27);
    break;
  case TYPE_STRING:
    paVar3 = &local_28;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"String",paVar3);
    std::allocator<char>::~allocator((allocator<char> *)&local_28);
    break;
  default:
    paVar3 = &local_2b;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"",paVar3);
    std::allocator<char>::~allocator((allocator<char> *)&local_2b);
    break;
  case TYPE_BYTES:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Bytes",&local_29);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
    break;
  case TYPE_ENUM:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Enum",&local_2a);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a);
  }
  return in_RDI;
}

Assistant:

std::string JSTypeTag(const FieldDescriptor* desc) {
  switch (desc->type()) {
    case FieldDescriptor::TYPE_DOUBLE:
    case FieldDescriptor::TYPE_FLOAT:
      return "Float";
    case FieldDescriptor::TYPE_INT32:
    case FieldDescriptor::TYPE_UINT32:
    case FieldDescriptor::TYPE_INT64:
    case FieldDescriptor::TYPE_UINT64:
    case FieldDescriptor::TYPE_FIXED32:
    case FieldDescriptor::TYPE_FIXED64:
    case FieldDescriptor::TYPE_SINT32:
    case FieldDescriptor::TYPE_SINT64:
    case FieldDescriptor::TYPE_SFIXED32:
    case FieldDescriptor::TYPE_SFIXED64:
      if (IsIntegralFieldWithStringJSType(desc)) {
        return "StringInt";
      } else {
        return "Int";
      }
    case FieldDescriptor::TYPE_BOOL:
      return "Boolean";
    case FieldDescriptor::TYPE_STRING:
      return "String";
    case FieldDescriptor::TYPE_BYTES:
      return "Bytes";
    case FieldDescriptor::TYPE_ENUM:
      return "Enum";
    default:
      assert(false);
  }
  return "";
}